

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

object __thiscall
pybind11::detail::simple_collector<(pybind11::return_value_policy)1>::call
          (simple_collector<(pybind11::return_value_policy)1> *this,PyObject *ptr)

{
  PyObject *pPVar1;
  error_already_set *this_00;
  
  pPVar1 = (PyObject *)PyObject_CallObject();
  if (pPVar1 != (PyObject *)0x0) {
    (this->m_args).super_object.super_handle.m_ptr = pPVar1;
    return (object)(handle)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

object call(PyObject *ptr) const {
        PyObject *result = PyObject_CallObject(ptr, m_args.ptr());
        if (!result)
            throw error_already_set();
        return reinterpret_steal<object>(result);
    }